

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_7352a::ir_copy_propagation_elements_visitor::visit_leave
          (ir_copy_propagation_elements_visitor *this,ir_assignment *ir)

{
  bool bVar1;
  int iVar2;
  ir_dereference_variable *piVar3;
  undefined4 extraout_var;
  int extraout_EDX;
  int extraout_EDX_00;
  kill_entry *local_30;
  kill_entry *k;
  ir_variable *var;
  ir_dereference_variable *lhs;
  ir_assignment *ir_local;
  ir_copy_propagation_elements_visitor *this_local;
  ir_variable *var_00;
  
  piVar3 = ir_instruction::as_dereference_variable((ir_instruction *)ir->lhs);
  iVar2 = (*(ir->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])();
  var_00 = (ir_variable *)CONCAT44(extraout_var,iVar2);
  if ((piVar3 == (ir_dereference_variable *)0x0) ||
     (bVar1 = glsl_type::is_vector(var_00->type), !bVar1)) {
    local_30 = (kill_entry *)(anonymous_namespace)::kill_entry::operator_new(0x20,this->lin_ctx);
    kill_entry::kill_entry(local_30,var_00,-1);
    iVar2 = extraout_EDX_00;
  }
  else {
    local_30 = (kill_entry *)(anonymous_namespace)::kill_entry::operator_new(0x20,this->lin_ctx);
    kill_entry::kill_entry(local_30,var_00,(uint)(ir->field_0x38 & 0xf));
    iVar2 = extraout_EDX;
  }
  kill(this,(__pid_t)local_30,iVar2);
  add_copy(this,ir);
  return visit_continue;
}

Assistant:

ir_visitor_status
ir_copy_propagation_elements_visitor::visit_leave(ir_assignment *ir)
{
   ir_dereference_variable *lhs = ir->lhs->as_dereference_variable();
   ir_variable *var = ir->lhs->variable_referenced();

   kill_entry *k;

   if (lhs && var->type->is_vector())
      k = new(this->lin_ctx) kill_entry(var, ir->write_mask);
   else
      k = new(this->lin_ctx) kill_entry(var, ~0);

   kill(k);

   add_copy(ir);

   return visit_continue;
}